

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ColumnsFromExprList(Parse *pParse,ExprList *pEList,i16 *pnCol,Column **paCol)

{
  ExprList_item *data;
  byte *pbVar1;
  uint uVar2;
  sqlite3 *db;
  Table *pTVar3;
  i16 *piVar4;
  ulong uVar5;
  u8 uVar6;
  ushort uVar7;
  u32 uVar8;
  uint uVar9;
  Column *pCVar10;
  Expr *pEVar11;
  Column *pCVar12;
  byte *pKey;
  void *pvVar13;
  undefined1 *puVar14;
  Column **extraout_RAX;
  Column **ppCVar15;
  ulong uVar16;
  byte bVar17;
  char *zIn;
  long lVar18;
  u32 cnt;
  ulong local_78;
  Column **local_70;
  ulong local_68;
  i16 *local_60;
  ExprList_item *local_58;
  Column *local_50;
  Hash ht;
  
  db = pParse->db;
  ht.ht = (_ht *)0x0;
  ht.htsize = 0;
  ht.count = 0;
  ht.first = (HashElem *)0x0;
  local_70 = paCol;
  if (pEList == (ExprList *)0x0) {
    pCVar10 = (Column *)0x0;
    uVar9 = 0;
  }
  else {
    uVar2 = pEList->nExpr;
    pCVar10 = (Column *)sqlite3DbMallocZero(db,(long)(int)uVar2 << 4);
    uVar9 = 0x7fff;
    if ((int)uVar2 < 0x7fff) {
      uVar9 = uVar2;
    }
  }
  *pnCol = (i16)uVar9;
  *local_70 = pCVar10;
  local_58 = pEList->a;
  local_78 = (ulong)uVar9;
  if ((int)uVar9 < 1) {
    local_78 = 0;
  }
  uVar16 = 0;
  local_60 = pnCol;
  local_50 = pCVar10;
  do {
    pCVar12 = local_50;
    uVar5 = local_78;
    if ((uVar16 == local_78) || (uVar5 = uVar16, db->mallocFailed != '\0')) {
      local_78 = uVar5;
      sqlite3HashClear(&ht);
      piVar4 = local_60;
      ppCVar15 = extraout_RAX;
      if (db->mallocFailed != '\0') {
        uVar16 = local_78 & 0xffffffff;
        for (lVar18 = 0; uVar16 << 4 != lVar18; lVar18 = lVar18 + 0x10) {
          sqlite3DbFree(db,*(void **)((long)&pCVar12->zCnName + lVar18));
        }
        sqlite3DbFree(db,pCVar12);
        *local_70 = (Column *)0x0;
        *piVar4 = 0;
        ppCVar15 = local_70;
      }
      return (int)ppCVar15;
    }
    data = local_58 + uVar16;
    zIn = local_58[uVar16].zEName;
    local_68 = uVar16;
    if ((zIn == (char *)0x0) || (((data->fg).field_0x1 & 3) != 0)) {
      for (pEVar11 = sqlite3ExprSkipCollateAndLikely(data->pExpr); uVar6 = pEVar11->op,
          uVar6 == 0x8d; pEVar11 = pEVar11->pRight) {
      }
      if (uVar6 == ';') {
        pCVar12 = (Column *)&pEVar11->u;
LAB_0019ec0a:
        zIn = pCVar12->zCnName;
      }
      else if (((uVar6 == 0xa7) && ((pEVar11->flags & 0x3000000) == 0)) &&
              (pTVar3 = (pEVar11->y).pTab, pTVar3 != (Table *)0x0)) {
        uVar7 = pEVar11->iColumn;
        if ((short)uVar7 < 0) {
          uVar7 = pTVar3->iPKey;
          zIn = "rowid";
          if ((short)uVar7 < 0) goto LAB_0019ec12;
        }
        pCVar12 = pTVar3->aCol + uVar7;
        goto LAB_0019ec0a;
      }
      if (zIn != (char *)0x0) goto LAB_0019ec12;
LAB_0019ec1e:
      pKey = (byte *)sqlite3MPrintf(db,"column%d",(ulong)((int)local_68 + 1));
    }
    else {
LAB_0019ec12:
      uVar8 = sqlite3IsTrueOrFalse(zIn);
      if (uVar8 != 0) goto LAB_0019ec1e;
      pKey = (byte *)sqlite3DbStrDup(db,zIn);
    }
    cnt = 0;
    while ((pKey != (byte *)0x0 &&
           (pvVar13 = sqlite3HashFind(&ht,(char *)pKey), pvVar13 != (void *)0x0))) {
      if ((*(byte *)((long)pvVar13 + 0x11) & 0x80) != 0) {
        pbVar1 = (byte *)((long)&pCVar10->colFlags + 1);
        *pbVar1 = *pbVar1 | 4;
      }
      uVar9 = sqlite3Strlen30((char *)pKey);
      if (uVar9 == 0) {
        uVar9 = 0;
      }
      else {
        uVar16 = (ulong)uVar9;
        do {
          if (uVar16 < 2) {
            bVar17 = *pKey;
            uVar16 = 0;
            break;
          }
          uVar16 = uVar16 - 1;
          bVar17 = pKey[uVar16 & 0xffffffff];
        } while (0xfffffffffffffff5 < (ulong)bVar17 - 0x3a);
        if (bVar17 == 0x3a) {
          uVar9 = (uint)uVar16;
        }
      }
      cnt = cnt + 1;
      pKey = (byte *)sqlite3MPrintf(db,"%.*z:%u",(ulong)uVar9,pKey);
      if (3 < cnt) {
        sqlite3_randomness(4,&cnt);
      }
    }
    pCVar10->zCnName = (char *)pKey;
    uVar6 = sqlite3StrIHash((char *)pKey);
    pCVar10->hName = uVar6;
    if (((data->fg).field_0x2 & 1) != 0) {
      pbVar1 = (byte *)((long)&pCVar10->colFlags + 1);
      *pbVar1 = *pbVar1 | 4;
    }
    if ((pKey != (byte *)0x0) &&
       (puVar14 = (undefined1 *)sqlite3HashInsert(&ht,(char *)pKey,data),
       (ExprList_item *)puVar14 == data)) {
      sqlite3OomFault(db);
    }
    uVar16 = local_68 + 1;
    pCVar10 = pCVar10 + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3ColumnsFromExprList(
  Parse *pParse,          /* Parsing context */
  ExprList *pEList,       /* Expr list from which to derive column names */
  i16 *pnCol,             /* Write the number of columns here */
  Column **paCol          /* Write the new column list here */
){
  sqlite3 *db = pParse->db;   /* Database connection */
  int i, j;                   /* Loop counters */
  u32 cnt;                    /* Index added to make the name unique */
  Column *aCol, *pCol;        /* For looping over result columns */
  int nCol;                   /* Number of columns in the result set */
  char *zName;                /* Column name */
  int nName;                  /* Size of name in zName[] */
  Hash ht;                    /* Hash table of column names */
  Table *pTab;

  sqlite3HashInit(&ht);
  if( pEList ){
    nCol = pEList->nExpr;
    aCol = sqlite3DbMallocZero(db, sizeof(aCol[0])*nCol);
    testcase( aCol==0 );
    if( NEVER(nCol>32767) ) nCol = 32767;
  }else{
    nCol = 0;
    aCol = 0;
  }
  assert( nCol==(i16)nCol );
  *pnCol = nCol;
  *paCol = aCol;

  for(i=0, pCol=aCol; i<nCol && !db->mallocFailed; i++, pCol++){
    struct ExprList_item *pX = &pEList->a[i];
    struct ExprList_item *pCollide;
    /* Get an appropriate name for the column
    */
    if( (zName = pX->zEName)!=0 && pX->fg.eEName==ENAME_NAME ){
      /* If the column contains an "AS <name>" phrase, use <name> as the name */
    }else{
      Expr *pColExpr = sqlite3ExprSkipCollateAndLikely(pX->pExpr);
      while( ALWAYS(pColExpr!=0) && pColExpr->op==TK_DOT ){
        pColExpr = pColExpr->pRight;
        assert( pColExpr!=0 );
      }
      if( pColExpr->op==TK_COLUMN
       && ALWAYS( ExprUseYTab(pColExpr) )
       && ALWAYS( pColExpr->y.pTab!=0 )
      ){
        /* For columns use the column name name */
        int iCol = pColExpr->iColumn;
        pTab = pColExpr->y.pTab;
        if( iCol<0 ) iCol = pTab->iPKey;
        zName = iCol>=0 ? pTab->aCol[iCol].zCnName : "rowid";
      }else if( pColExpr->op==TK_ID ){
        assert( !ExprHasProperty(pColExpr, EP_IntValue) );
        zName = pColExpr->u.zToken;
      }else{
        /* Use the original text of the column expression as its name */
        assert( zName==pX->zEName );  /* pointer comparison intended */
      }
    }
    if( zName && !sqlite3IsTrueOrFalse(zName) ){
      zName = sqlite3DbStrDup(db, zName);
    }else{
      zName = sqlite3MPrintf(db,"column%d",i+1);
    }

    /* Make sure the column name is unique.  If the name is not unique,
    ** append an integer to the name so that it becomes unique.
    */
    cnt = 0;
    while( zName && (pCollide = sqlite3HashFind(&ht, zName))!=0 ){
      if( pCollide->fg.bUsingTerm ){
        pCol->colFlags |= COLFLAG_NOEXPAND;
      }
      nName = sqlite3Strlen30(zName);
      if( nName>0 ){
        for(j=nName-1; j>0 && sqlite3Isdigit(zName[j]); j--){}
        if( zName[j]==':' ) nName = j;
      }
      zName = sqlite3MPrintf(db, "%.*z:%u", nName, zName, ++cnt);
      if( cnt>3 ) sqlite3_randomness(sizeof(cnt), &cnt);
    }
    pCol->zCnName = zName;
    pCol->hName = sqlite3StrIHash(zName);
    if( pX->fg.bNoExpand ){
      pCol->colFlags |= COLFLAG_NOEXPAND;
    }
    sqlite3ColumnPropertiesFromName(0, pCol);
    if( zName && sqlite3HashInsert(&ht, zName, pX)==pX ){
      sqlite3OomFault(db);
    }
  }
  sqlite3HashClear(&ht);
  if( db->mallocFailed ){
    for(j=0; j<i; j++){
      sqlite3DbFree(db, aCol[j].zCnName);
    }
    sqlite3DbFree(db, aCol);
    *paCol = 0;
    *pnCol = 0;
    return SQLITE_NOMEM_BKPT;
  }
  return SQLITE_OK;
}